

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall nuraft::asio_service_impl::worker_entry(asio_service_impl *this)

{
  atomic<unsigned_int> *paVar1;
  uint __val;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  pthread_t __target_thread;
  string local_78;
  string thread_name;
  
  LOCK();
  paVar1 = &this->worker_id_;
  __val = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  std::__cxx11::to_string(&local_78,__val);
  std::operator+(&thread_name,"nuraft_w_",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,thread_name._M_dataplus._M_p);
  if ((this->my_opt_).worker_start_.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(unsigned_int)>::operator()(&(this->my_opt_).worker_start_,__val);
  }
  if ((worker_entry()::timer == '\0') &&
     (iVar4 = __cxa_guard_acquire(&worker_entry()::timer), iVar4 != 0)) {
    timer_helper::timer_helper(&worker_entry::timer,60000000,false);
    __cxa_guard_release(&worker_entry()::timer);
  }
  do {
    LOCK();
    (this->num_active_workers_).super___atomic_base<unsigned_int>._M_i =
         (this->num_active_workers_).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    asio::io_context::run(&this->io_svc_);
    LOCK();
    (this->num_active_workers_).super___atomic_base<unsigned_int>._M_i =
         (this->num_active_workers_).super___atomic_base<unsigned_int>._M_i - 1;
    UNLOCK();
    bVar3 = timer_helper::timeout_and_reset(&worker_entry::timer);
    if (bVar3) {
      LOCK();
      worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)0;
      UNLOCK();
    }
    else if (10 < (ulong)worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar4 = (**(code **)(*(long *)peVar2 + 0x38))(), 0 < iVar4)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_78,"too many exceptions (%zu) in 1-min time window.",
                   worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"worker_entry",0x719,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      LOCK();
      worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)0;
      UNLOCK();
      abort();
    }
  } while ((this->stopping_status_).super___atomic_base<unsigned_char>._M_i != '\x01');
  if ((this->my_opt_).worker_stop_.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(unsigned_int)>::operator()(&(this->my_opt_).worker_stop_,__val);
  }
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) &&
     (iVar4 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar4)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_78,"end of asio worker thread, remaining threads: %u",
               (ulong)(this->num_active_workers_).super___atomic_base<unsigned_int>._M_i);
    (**(code **)(*(long *)peVar2 + 0x40))
              (peVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"worker_entry",0x725,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)&thread_name);
  return;
}

Assistant:

void asio_service_impl::worker_entry() {
    uint32_t worker_id = worker_id_.fetch_add(1);
    std::string thread_name = "nuraft_w_" + std::to_string(worker_id);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    if (my_opt_.worker_start_) {
        my_opt_.worker_start_(worker_id);
    }

    static std::atomic<size_t> exception_count(0);
    static timer_helper timer(60 * 1000000); // 1 min.
    const size_t MAX_COUNT = 10;

    do {
        try {
            num_active_workers_.fetch_add(1);
            io_svc_.run();
            num_active_workers_.fetch_sub(1);

        } catch (std::exception& ee) {
            // LCOV_EXCL_START
            num_active_workers_.fetch_sub(1);
            exception_count++;
            p_er("asio worker thread got exception: %s, "
                 "current number of workers: %u, "
                 "exception count (in 1-min window): %zu, "
                 "stopping status %u",
                 ee.what(),
                 num_active_workers_.load(),
                 exception_count.load(),
                 stopping_status_.load());
            // LCOV_EXCL_STOP
        }

        // LCOV_EXCL_START
        if (timer.timeout_and_reset()) {
            exception_count = 0;

        } else if (exception_count > MAX_COUNT) {
            p_ft("too many exceptions (%zu) in 1-min time window.",
                 exception_count.load());
            exception_count = 0;
            abort();
        }
        // LCOV_EXCL_STOP
    } while (stopping_status_ != 1);

    if (my_opt_.worker_stop_) {
        my_opt_.worker_stop_(worker_id);
    }

    p_in("end of asio worker thread, remaining threads: %u",
         num_active_workers_.load());
}